

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.hxx
# Opt level: O0

void __thiscall
markurem::matching::
Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
::step_two(Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
           *this)

{
  vector<double,_std::allocator<double>_> *this_00;
  bool bVar1;
  pointer pAVar2;
  Value VVar3;
  reference pvVar4;
  reference pvVar5;
  vector<bool,_std::allocator<bool>_> *in_RDI;
  AdjacencyIterator it;
  unsigned_long *row;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *in_stack_ffffffffffffff48;
  Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
  *in_stack_ffffffffffffff50;
  uint7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  reference local_88;
  reference in_stack_ffffffffffffff88;
  reference local_68;
  reference local_58;
  Adjacency<unsigned_long> *local_48;
  __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
  local_40;
  reference local_38;
  reference local_28;
  unsigned_long *local_20;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_18;
  uint *local_10;
  
  local_10 = &(in_RDI->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_offset;
  local_18._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff48
                 );
  local_20 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_ffffffffffffff48);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             *)in_stack_ffffffffffffff50,
                            (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             *)in_stack_ffffffffffffff48), bVar1) {
    local_28 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_18);
    local_38 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (in_RDI,CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_38);
    if (!bVar1) {
      local_40._M_current =
           (Adjacency<unsigned_long> *)
           andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
           adjacenciesFromVertexBegin(in_stack_ffffffffffffff48,0x1cf62e);
      while( true ) {
        local_48 = (Adjacency<unsigned_long> *)
                   andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
                   adjacenciesFromVertexEnd(in_stack_ffffffffffffff48,0x1cf64b);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                            *)in_stack_ffffffffffffff50,
                           (__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                            *)in_stack_ffffffffffffff48);
        if (!bVar1) break;
        pAVar2 = __gnu_cxx::
                 __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                 ::operator->(&local_40);
        andres::graph::Adjacency<unsigned_long>::vertex(pAVar2);
        col_of_idx(in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48);
        local_58 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (in_RDI,CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
        bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_58);
        in_stack_ffffffffffffff6f = false;
        if (!bVar1) {
          local_68 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               (in_RDI,(ulong)in_stack_ffffffffffffff68);
          bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_68);
          in_stack_ffffffffffffff6f = false;
          if (!bVar1) {
            this_00 = *(vector<double,_std::allocator<double>_> **)
                       &(in_RDI->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
            pAVar2 = __gnu_cxx::
                     __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                     ::operator->(&local_40);
            VVar3 = andres::graph::Adjacency<unsigned_long>::edge(pAVar2);
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](this_00,VVar3);
            in_stack_ffffffffffffff6f = *pvVar4 == 0.0;
          }
        }
        if ((bool)in_stack_ffffffffffffff6f != false) {
          in_stack_ffffffffffffff48 =
               (Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
               &in_RDI[2].super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage;
          pAVar2 = __gnu_cxx::
                   __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                   ::operator->(&local_40);
          andres::graph::Adjacency<unsigned_long>::vertex(pAVar2);
          col_of_idx(in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48);
          in_stack_ffffffffffffff88 =
               std::vector<bool,_std::allocator<bool>_>::operator[]
                         (in_RDI,CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
          std::_Bit_reference::operator=((_Bit_reference *)&stack0xffffffffffffff88,true);
          local_88 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               (in_RDI,CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68)
                               );
          std::_Bit_reference::operator=(&local_88,true);
          in_stack_ffffffffffffff50 =
               (Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
                *)(in_RDI->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
          pAVar2 = __gnu_cxx::
                   __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                   ::operator->(&local_40);
          VVar3 = andres::graph::Adjacency<unsigned_long>::edge(pAVar2);
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff50,VVar3);
          *pvVar5 = 1;
        }
        __gnu_cxx::
        __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
        ::operator++(&local_40);
      }
    }
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_18);
  }
  clear_covers((Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
                *)in_stack_ffffffffffffff88._M_mask);
  in_RDI[4].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 2;
  return;
}

Assistant:

void
Matching<GRAPH, COST, MASK>::step_two()
{
    for (auto const& row : rows_) {
        if (row_cover[row])
            continue;

        for (auto it = graph_.adjacenciesFromVertexBegin(row);
             it != graph_.adjacenciesFromVertexEnd(row); ++it) {

            // star zero entries.
            if (!col_cover[col_of_idx(it->vertex())] && !row_cover[row] &&
                costs_[it->edge()] == 0) {
                col_cover[col_of_idx(it->vertex())] = true;
                row_cover[row] = true;
                mask_[it->edge()] = STARRED;
            }
        }
    }

    // reset covers.
    clear_covers();

    step_ = Step::THREE;
}